

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O0

void bandGBTRS(realtype **a,sunindextype n,sunindextype smu,sunindextype ml,sunindextype *p,
              realtype *b)

{
  double dVar1;
  long lVar2;
  realtype *prVar3;
  long local_80;
  long local_78;
  realtype *diag_k;
  realtype mult;
  sunindextype last_row_k;
  sunindextype first_row_k;
  sunindextype i;
  sunindextype l;
  sunindextype k;
  realtype *b_local;
  sunindextype *p_local;
  sunindextype ml_local;
  sunindextype smu_local;
  sunindextype n_local;
  realtype **a_local;
  
  for (l = 0; l < n + -1; l = l + 1) {
    lVar2 = p[l];
    dVar1 = b[lVar2];
    if (lVar2 != l) {
      b[lVar2] = b[l];
      b[l] = dVar1;
    }
    prVar3 = a[l];
    first_row_k = l;
    if (n + -1 < l + ml) {
      local_78 = n + -1;
    }
    else {
      local_78 = l + ml;
    }
    while (first_row_k = first_row_k + 1, first_row_k <= local_78) {
      b[first_row_k] = dVar1 * prVar3[smu + (first_row_k - l)] + b[first_row_k];
    }
  }
  for (l = n + -1; -1 < l; l = l + -1) {
    prVar3 = a[l];
    if (l - smu < 0) {
      local_80 = 0;
    }
    else {
      local_80 = l - smu;
    }
    b[l] = b[l] / prVar3[smu];
    dVar1 = b[l];
    for (first_row_k = local_80; first_row_k <= l + -1; first_row_k = first_row_k + 1) {
      b[first_row_k] = -dVar1 * (prVar3 + smu)[first_row_k - l] + b[first_row_k];
    }
  }
  return;
}

Assistant:

void bandGBTRS(realtype **a, sunindextype n, sunindextype smu, sunindextype ml, sunindextype *p, realtype *b)
{
  sunindextype k, l, i, first_row_k, last_row_k;
  realtype mult, *diag_k;
  
  /* Solve Ly = Pb, store solution y in b */
  
  for (k=0; k < n-1; k++) {
    l = p[k];
    mult = b[l];
    if (l != k) {
      b[l] = b[k];
      b[k] = mult;
    }
    diag_k = a[k]+smu;
    last_row_k = SUNMIN(n-1,k+ml);
    for (i=k+1; i <= last_row_k; i++)
      b[i] += mult * diag_k[i-k];
  }
  
  /* Solve Ux = y, store solution x in b */
  
  for (k=n-1; k >= 0; k--) {
    diag_k = a[k]+smu;
    first_row_k = SUNMAX(0,k-smu);
    b[k] /= (*diag_k);
    mult = -b[k];
    for (i=first_row_k; i <= k-1; i++)
      b[i] += mult*diag_k[i-k];
  }
}